

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.c
# Opt level: O3

h2o_cache_ref_t *
h2o_cache_fetch(h2o_cache_t *cache,uint64_t now,h2o_iovec_t key,h2o_cache_hashcode_t keyhash)

{
  uint uVar1;
  uint uVar2;
  kh_cache_t *pkVar3;
  khint32_t *pkVar4;
  st_h2o_linklist_t *psVar5;
  st_h2o_linklist_t *psVar6;
  uint uVar7;
  int iVar8;
  size_t sVar9;
  ulong uVar10;
  byte bVar11;
  size_t __n;
  uint uVar12;
  uint uVar13;
  int iVar14;
  h2o_cache_ref_t *phVar15;
  
  __n = key.len;
  if (keyhash == 0) {
    keyhash = 0;
    for (sVar9 = __n; sVar9 != 0; sVar9 = sVar9 - 1) {
      keyhash = (uint)(byte)key.base[sVar9 - 1] + keyhash * 0x1f;
    }
  }
  if ((cache->flags & 1) != 0) {
    pthread_mutex_lock((pthread_mutex_t *)&cache->mutex);
  }
  purge(cache,now);
  pkVar3 = cache->table;
  uVar1 = pkVar3->n_buckets;
  if (uVar1 == 0) {
    uVar12 = 0;
LAB_001277c3:
    if (uVar12 != uVar1) {
      phVar15 = pkVar3->keys[uVar12];
      uVar10 = (cache->duration - now) + phVar15->at;
      if (-1 < (long)uVar10) {
        if (((9 < uVar10) || ((cache->flags & 2U) == 0)) || (phVar15->_requested_early_update != 0))
        {
          psVar5 = (phVar15->_lru_link).next;
          psVar6 = (phVar15->_lru_link).prev;
          psVar5->prev = psVar6;
          psVar6->next = psVar5;
          (phVar15->_lru_link).next = (st_h2o_linklist_t *)0x0;
          (phVar15->_lru_link).prev = (st_h2o_linklist_t *)0x0;
          psVar5 = (cache->lru).prev;
          (phVar15->_lru_link).prev = psVar5;
          (phVar15->_lru_link).next = &cache->lru;
          psVar5->next = &phVar15->_lru_link;
          ((phVar15->_lru_link).next)->prev = &phVar15->_lru_link;
          LOCK();
          phVar15->_refcnt = phVar15->_refcnt + 1;
          UNLOCK();
          goto LAB_00127848;
        }
        phVar15->_requested_early_update = 1;
      }
    }
  }
  else {
    uVar13 = keyhash & uVar1 - 1;
    pkVar4 = pkVar3->flags;
    iVar14 = 1;
    uVar12 = uVar13;
    do {
      uVar2 = pkVar4[uVar12 >> 4];
      bVar11 = (char)uVar12 * '\x02' & 0x1e;
      uVar7 = uVar2 >> bVar11;
      if (((uVar7 & 2) != 0) ||
         ((((uVar7 & 1) == 0 && ((pkVar3->keys[uVar12]->key).len == __n)) &&
          (iVar8 = bcmp((pkVar3->keys[uVar12]->key).base,key.base,__n), iVar8 == 0)))) {
        if ((uVar2 >> bVar11 & 3) != 0) {
          uVar12 = uVar1;
        }
        goto LAB_001277c3;
      }
      uVar12 = uVar12 + iVar14 & uVar1 - 1;
      iVar14 = iVar14 + 1;
    } while (uVar12 != uVar13);
  }
  phVar15 = (h2o_cache_ref_t *)0x0;
LAB_00127848:
  if ((cache->flags & 1) != 0) {
    pthread_mutex_unlock((pthread_mutex_t *)&cache->mutex);
  }
  return phVar15;
}

Assistant:

h2o_cache_ref_t *h2o_cache_fetch(h2o_cache_t *cache, uint64_t now, h2o_iovec_t key, h2o_cache_hashcode_t keyhash)
{
    h2o_cache_ref_t search_key, *ref;
    khiter_t iter;
    int64_t timeleft;

    if (keyhash == 0)
        keyhash = h2o_cache_calchash(key.base, key.len);
    search_key.key = key;
    search_key.keyhash = keyhash;

    lock_cache(cache);

    purge(cache, now);

    if ((iter = kh_get(cache, cache->table, &search_key)) == kh_end(cache->table))
        goto NotFound;

    /* found */
    ref = kh_key(cache->table, iter);
    timeleft = get_timeleft(cache, ref, now);
    if (timeleft < 0)
        goto NotFound;
    if ((cache->flags & H2O_CACHE_FLAG_EARLY_UPDATE) != 0 && timeleft < 10 && !ref->_requested_early_update) {
        ref->_requested_early_update = 1;
        goto NotFound;
    }
    /* move the entry to the top of LRU */
    h2o_linklist_unlink(&ref->_lru_link);
    h2o_linklist_insert(&cache->lru, &ref->_lru_link);
    __sync_fetch_and_add(&ref->_refcnt, 1);

    /* unlock and return the found entry */
    unlock_cache(cache);
    return ref;

NotFound:
    unlock_cache(cache);
    return NULL;
}